

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  cmDependsFortranInternals *this_00;
  bool bVar1;
  cmMakefile *this_01;
  string *psVar2;
  ulong uVar3;
  ObjectInfoMap *this_02;
  reference obj;
  reference pbVar4;
  ostream *poVar5;
  string *stamp_dir_00;
  string local_6b8;
  string local_698;
  string local_678;
  undefined1 local_658 [8];
  string stamp;
  string mod_lower;
  string mod_upper;
  string *i_2;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string currentBinDir;
  cmGeneratedFileStream fcStream;
  string fcName;
  string *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provides;
  cmGeneratedFileStream fiStream;
  string fiName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  *i;
  const_iterator __end1;
  const_iterator __begin1;
  ObjectInfoMap *__range1;
  ObjectInfoMap *objInfo;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string mod_dir;
  cmMakefile *mf;
  string *stamp_dir;
  ostream *internalDepends_local;
  ostream *makeDepends_local;
  cmDependsFortran *this_local;
  
  LocateModules(this);
  stamp_dir_00 = &(this->super_cmDepends).TargetDirectory;
  this_01 = cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
  mod_dir.field_2._8_8_ = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_Fortran_TARGET_MODULE_DIR",&local_79);
  psVar2 = cmMakefile::GetSafeDefinition(this_01,&local_78);
  std::__cxx11::string::string((string *)local_58,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::operator=((string *)local_58,(string *)psVar2);
  }
  this_02 = &this->Internal->ObjectInfo;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
           ::begin(this_02);
  i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
         ::end(this_02);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&fiStream.field_0x240,(string *)&(this->super_cmDepends).TargetDirectory)
      ;
      std::__cxx11::string::operator+=((string *)&fiStream.field_0x240,"/fortran.internal");
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&provides,(string *)&fiStream.field_0x240,false,None);
      std::operator<<((ostream *)&provides,"# The fortran modules provided by this target.\n");
      std::operator<<((ostream *)&provides,"provides\n");
      this_00 = this->Internal;
      __end1_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this_00->TargetProvides);
      i_1 = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this_00->TargetProvides);
      while (bVar1 = std::operator!=(&__end1_1,(_Self *)&i_1), bVar1) {
        pbVar4 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1_1);
        poVar5 = std::operator<<((ostream *)&provides," ");
        poVar5 = std::operator<<(poVar5,(string *)pbVar4);
        std::operator<<(poVar5,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1_1);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->TargetProvides);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)&fcStream.field_0x240,
                   (string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::operator+=
                  ((string *)&fcStream.field_0x240,"/cmake_clean_Fortran.cmake");
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)((long)&currentBinDir.field_2 + 8),
                   (string *)&fcStream.field_0x240,false,None);
        std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),
                        "# Remove fortran modules provided by this target.\n");
        std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"FILE(REMOVE");
        psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           ((this->super_cmDepends).LocalGenerator);
        std::__cxx11::string::string((string *)&__range2,(string *)psVar2);
        __end2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this_00->TargetProvides);
        i_2 = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this_00->TargetProvides);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&i_2), bVar1) {
          pbVar4 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end2);
          std::__cxx11::string::string
                    ((string *)(mod_lower.field_2._M_local_buf + 8),(string *)local_58);
          std::__cxx11::string::operator+=((string *)(mod_lower.field_2._M_local_buf + 8),"/");
          std::__cxx11::string::string
                    ((string *)(stamp.field_2._M_local_buf + 8),(string *)local_58);
          std::__cxx11::string::operator+=((string *)(stamp.field_2._M_local_buf + 8),"/");
          cmFortranModuleAppendUpperLower
                    (pbVar4,(string *)((long)&mod_lower.field_2 + 8),
                     (string *)((long)&stamp.field_2 + 8));
          std::__cxx11::string::string((string *)local_658,(string *)stamp_dir_00);
          std::__cxx11::string::operator+=((string *)local_658,"/");
          std::__cxx11::string::operator+=((string *)local_658,(string *)pbVar4);
          std::__cxx11::string::operator+=((string *)local_658,".stamp");
          std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"\n");
          poVar5 = std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  \"");
          MaybeConvertToRelativePath
                    (&local_678,this,(string *)&__range2,(string *)((long)&stamp.field_2 + 8));
          poVar5 = std::operator<<(poVar5,(string *)&local_678);
          std::operator<<(poVar5,"\"\n");
          std::__cxx11::string::~string((string *)&local_678);
          poVar5 = std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  \"");
          MaybeConvertToRelativePath
                    (&local_698,this,(string *)&__range2,(string *)((long)&mod_lower.field_2 + 8));
          poVar5 = std::operator<<(poVar5,(string *)&local_698);
          std::operator<<(poVar5,"\"\n");
          std::__cxx11::string::~string((string *)&local_698);
          poVar5 = std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  \"");
          MaybeConvertToRelativePath(&local_6b8,this,(string *)&__range2,(string *)local_658);
          poVar5 = std::operator<<(poVar5,(string *)&local_6b8);
          std::operator<<(poVar5,"\"\n");
          std::__cxx11::string::~string((string *)&local_6b8);
          std::__cxx11::string::~string((string *)local_658);
          std::__cxx11::string::~string((string *)(stamp.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        std::operator<<((ostream *)((long)&currentBinDir.field_2 + 8),"  )\n");
        std::__cxx11::string::~string((string *)&__range2);
        cmGeneratedFileStream::~cmGeneratedFileStream
                  ((cmGeneratedFileStream *)((long)&currentBinDir.field_2 + 8));
        std::__cxx11::string::~string((string *)&fcStream.field_0x240);
      }
      this_local._7_1_ = true;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&provides);
      std::__cxx11::string::~string((string *)&fiStream.field_0x240);
LAB_0063b3c1:
      std::__cxx11::string::~string((string *)local_58);
      return this_local._7_1_;
    }
    obj = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
          ::operator*(&__end1);
    bVar1 = WriteDependenciesReal
                      (this,&obj->first,&obj->second,(string *)local_58,stamp_dir_00,makeDepends,
                       internalDepends);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0063b3c1;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const std::string& stamp_dir = this->TargetDirectory;

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& i : objInfo) {
    if (!this->WriteDependenciesReal(i.first, i.second, mod_dir, stamp_dir,
                                     makeDepends, internalDepends)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName);
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    fiStream << " " << i << "\n";
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName);
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    std::string currentBinDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& i : provides) {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      cmFortranModuleAppendUpperLower(i, mod_upper, mod_lower);
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += i;
      stamp += ".stamp";
      fcStream << "\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_lower)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_upper)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}